

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
write_decimal<unsigned_long_long>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
           *this,unsigned_long_long value)

{
  type pwVar1;
  wchar_t *pwVar2;
  wchar_t *local_38;
  wchar_t **local_30;
  type *it;
  int num_digits;
  bool is_negative;
  main_type abs_value;
  unsigned_long_long value_local;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> *this_local;
  
  _num_digits = value;
  abs_value = value;
  value_local = (unsigned_long_long)this;
  it._7_1_ = internal::is_negative<unsigned_long_long>(value);
  if ((bool)it._7_1_) {
    _num_digits = -_num_digits;
  }
  it._0_4_ = internal::count_digits(_num_digits);
  pwVar1 = reserve(this,(long)(int)(uint)((it._7_1_ & 1) != 0) + (long)(int)it);
  local_30 = &local_38;
  local_38 = pwVar1;
  if ((it._7_1_ & 1) != 0) {
    local_38 = pwVar1 + 1;
    *pwVar1 = L'-';
  }
  pwVar2 = internal::format_decimal<wchar_t,wchar_t*,unsigned_long>(local_38,_num_digits,(int)it);
  *local_30 = pwVar2;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }